

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int act_diff_nims(nt_opts *opts)

{
  char **ppcVar1;
  uint uVar2;
  nifti_image *s0;
  nifti_image *s1;
  
  if ((opts->infiles).len == 2) {
    if (2 < g_debug) {
      ppcVar1 = (opts->infiles).list;
      fprintf(_stderr,"-d nifti_image diff between %s and %s...\n",*ppcVar1,ppcVar1[1]);
    }
    s0 = nt_image_read(opts,*(opts->infiles).list,0);
    uVar2 = 1;
    if (s0 != (nifti_image *)0x0) {
      s1 = nt_image_read(opts,(opts->infiles).list[1],0);
      if (s1 == (nifti_image *)0x0) {
        free(s0);
      }
      else {
        if (1 < g_debug) {
          ppcVar1 = (opts->infiles).list;
          fprintf(_stderr,"\n-d nifti_image diffs between \'%s\' and \'%s\'...\n",*ppcVar1,
                  ppcVar1[1]);
        }
        if ((opts->flist).len < 1) {
          uVar2 = diff_nims(s0,s1,(uint)(0 < g_debug));
        }
        else {
          uVar2 = diff_nims_list(s0,s1,&opts->flist,(uint)(0 < g_debug));
        }
        if (g_debug < 2 || uVar2 != 0) {
          if (2 < g_debug) {
            fprintf(_stderr,"+d %d differences found\n",(ulong)uVar2);
          }
        }
        else {
          fwrite("+d no differences found\n",0x18,1,_stderr);
        }
        nifti_image_free(s0);
        nifti_image_free(s1);
        uVar2 = (uint)(0 < (int)uVar2);
      }
    }
  }
  else {
    fprintf(_stderr,"** -diff_nim requires 2 -infiles, have %d\n");
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int act_diff_nims( nt_opts * opts )
{
   nifti_image * nim0, * nim1;
   int           diffs = 0;

   if( opts->infiles.len != 2 ){
      fprintf(stderr,"** -diff_nim requires 2 -infiles, have %d\n",
              opts->infiles.len);
      return 1;
   }

   if( g_debug > 2 )
      fprintf(stderr,"-d nifti_image diff between %s and %s...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   /* get the nifiti images */

   nim0 = nt_image_read(opts, opts->infiles.list[0], 0);
   if( ! nim0 ) return 1;  /* errors have been printed */

   nim1 = nt_image_read(opts, opts->infiles.list[1], 0);
   if( ! nim1 ){ free(nim0); return 1; }

   if( g_debug > 1 )
      fprintf(stderr,"\n-d nifti_image diffs between '%s' and '%s'...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   if( opts->flist.len <= 0 )
      diffs = diff_nims(nim0, nim1, g_debug > 0);
   else
      diffs = diff_nims_list(nim0, nim1, &opts->flist, g_debug > 0);

   if( diffs == 0 && g_debug > 1 )
      fprintf(stderr,"+d no differences found\n");
   else if ( g_debug > 2 )
      fprintf(stderr,"+d %d differences found\n", diffs);

   nifti_image_free(nim0);
   nifti_image_free(nim1);

   return (diffs > 0);
}